

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O1

DdManager *
Llb_NonlinImageStart
          (Aig_Man_t *pAig,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vRoots,int *pVars2Q,int *pOrder,int fFirst,
          abctime TimeTarget)

{
  int iVar1;
  DdManager *table;
  long lVar2;
  long lVar3;
  timespec local_50;
  Vec_Ptr_t *local_40;
  int *local_38;
  
  local_40 = vRoots;
  local_38 = pVars2Q;
  iVar1 = clock_gettime(3,&local_50);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (p == (Llb_Mgr_t *)0x0) {
    table = Cudd_Init(pAig->vObjs->nSize,0,0x100,0x40000,0);
    table->TimeStop = TimeTarget;
    Cudd_ShuffleHeap(table,pOrder);
    Cudd_AutodynEnable(table,CUDD_REORDER_SYMM_SIFT);
    p = Llb_NonlinAlloc(pAig,vLeaves,local_40,local_38,table);
    iVar1 = Llb_NonlinStart(p);
    if (iVar1 == 0) {
      Llb_NonlinFree(p);
      p = (Llb_Mgr_t *)0x0;
      table = (DdManager *)0x0;
    }
    else {
      iVar1 = clock_gettime(3,&local_50);
      if (iVar1 < 0) {
        lVar3 = -1;
      }
      else {
        lVar3 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      timeBuild = timeBuild + lVar3 + lVar2;
    }
    return table;
  }
  __assert_fail("p == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb3Image.c"
                ,0x3c7,
                "DdManager *Llb_NonlinImageStart(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, int *, int, abctime)"
               );
}

Assistant:

DdManager * Llb_NonlinImageStart( Aig_Man_t * pAig, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vRoots, int * pVars2Q, int * pOrder, int fFirst, abctime TimeTarget )
{
    DdManager * dd;
    abctime clk = Abc_Clock();
    assert( p == NULL );
    // start a new manager (disable reordering)
    dd = Cudd_Init( Aig_ManObjNumMax(pAig), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    dd->TimeStop = TimeTarget;
    Cudd_ShuffleHeap( dd, pOrder );
//    if ( fFirst )
        Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    // start the manager
    p = Llb_NonlinAlloc( pAig, vLeaves, vRoots, pVars2Q, dd );
    if ( !Llb_NonlinStart( p ) )
    {
        Llb_NonlinFree( p );
        p = NULL;
        return NULL;
    }
    timeBuild += Abc_Clock() - clk;
//    if ( !fFirst )
//        Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    return dd;
}